

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidDeConvolution3DOutputShape(void)

{
  RepeatedField<long> *this;
  RepeatedField<unsigned_long> *this_00;
  RepeatedField<float> *pRVar1;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  bool bVar5;
  FeatureType *pFVar6;
  long *plVar7;
  FeatureDescription *pFVar8;
  ArrayFeatureType *pAVar9;
  NeuralNetworkLayer *pNVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  void *pvVar12;
  LayerUnion LVar13;
  unsigned_long *puVar14;
  WeightParams *pWVar15;
  float *pfVar16;
  ostream *poVar17;
  string *psVar18;
  long lVar19;
  undefined8 *puVar20;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar21;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_01;
  Arena *pAVar22;
  uint uVar23;
  int iVar24;
  Model m1;
  Result res;
  Model local_80;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_80,(Arena *)0x0,false);
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar22 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar22);
  }
  pRVar3 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00170dd9:
    pRVar21 = &(local_80.description_)->input_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar21->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar21->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar24 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar24) goto LAB_00170dd9;
    ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar24 + 1;
    pvVar12 = pRVar3->elements[iVar24];
  }
  puVar20 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"input",puVar20);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  this = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  if (uVar2 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 1);
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar2] = 1;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar2] = 1;
  }
  uVar23 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar23;
  if (uVar23 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 2);
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar23] = 3;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar23] = 3;
  }
  uVar23 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar23;
  if (uVar23 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 3);
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar23] = 0x20;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar23] = 0x20;
  }
  uVar23 = uVar2 + 3;
  (pAVar9->shape_).current_size_ = uVar23;
  if (uVar23 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 4);
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar23] = 100;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar23] = 100;
  }
  uVar23 = uVar2 + 4;
  (pAVar9->shape_).current_size_ = uVar23;
  if (uVar23 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar2 + 5);
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar23] = 100;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(this);
    plVar7[uVar23] = 100;
  }
  this->current_size_ = uVar2 + 5;
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar22 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar22);
  }
  pRVar3 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00171025:
    pRVar21 = &(local_80.description_)->output_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar21->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar21->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar24 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar24) goto LAB_00171025;
    ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar24 + 1;
    pvVar12 = pRVar3->elements[iVar24];
  }
  puVar20 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"probs",puVar20);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  if (local_80._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_80);
    local_80._oneof_case_[0] = 500;
    pAVar22 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    local_80.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar22);
  }
  (local_80.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_80.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00171126:
    this_01 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(local_80.Type_.pipeline_)->models_;
    pNVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_01->super_RepeatedPtrFieldBase).arena_);
    pNVar10 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_01,pNVar10);
  }
  else {
    iVar24 = (local_80.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar24) goto LAB_00171126;
    (local_80.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar24 + 1;
    pNVar10 = (NeuralNetworkLayer *)pRVar3->elements[iVar24];
  }
  pRVar3 = (pNVar10->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0017115f:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar10->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->input_).super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar24 = (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar24) goto LAB_0017115f;
    (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_ = iVar24 + 1;
    pvVar12 = pRVar3->elements[iVar24];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3a8ef3);
  pRVar3 = (pNVar10->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001711b0:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar10->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->output_).super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar24 = (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar24) goto LAB_001711b0;
    (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_ = iVar24 + 1;
    pvVar12 = pRVar3->elements[iVar24];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3977ad);
  if (pNVar10->_oneof_case_[0] == 0x5bf) {
    LVar13 = pNVar10->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar10);
    pNVar10->_oneof_case_[0] = 0x5bf;
    uVar4 = (pNVar10->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    LVar13.convolution3d_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::Convolution3DLayerParams>(pAVar22);
    (pNVar10->layer_).convolution3d_ = (Convolution3DLayerParams *)LVar13;
  }
  (LVar13.gru_)->outputgateweightmatrix_ = (WeightParams *)0x300000003;
  (LVar13.scale_)->scale_ = (WeightParams *)0x300000001;
  (LVar13.scale_)->bias_ = (WeightParams *)0x300000003;
  (LVar13.gru_)->outputgaterecursionmatrix_ = (WeightParams *)0x100000001;
  (LVar13.gru_)->updategatebiasvector_ = (WeightParams *)0x100000001;
  (LVar13.gru_)->resetgatebiasvector_ = (WeightParams *)0x100000001;
  *(undefined8 *)((long)&(LVar13.gru_)->outputgatebiasvector_ + 4) = 0;
  *(undefined8 *)((long)&(LVar13.convolution_)->weights_ + 4) = 0;
  (LVar13.convolution_)->bias_ = (WeightParams *)0x0;
  (LVar13.convolution_)->outputchannels_ = 0;
  (LVar13.convolution3d_)->isdeconvolution_ = true;
  this_00 = &(LVar13.convolution_)->kernelsize_;
  uVar2 = ((LVar13.convolution_)->kernelsize_).current_size_;
  if (uVar2 == ((LVar13.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this_00,uVar2 + 1);
    puVar14 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
    puVar14[uVar2] = 4;
  }
  else {
    puVar14 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
    puVar14[uVar2] = 4;
  }
  ((LVar13.convolution_)->kernelsize_).current_size_ = uVar2 + 1;
  (LVar13.convolution3d_)->hasbias_ = true;
  iVar24 = 0xf3;
  do {
    pWVar15 = (LVar13.batchnorm_)->variance_;
    if (pWVar15 == (WeightParams *)0x0) {
      uVar4 = ((LVar13.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
      pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        pAVar22 = *(Arena **)pAVar22;
      }
      pWVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar22);
      (LVar13.batchnorm_)->variance_ = pWVar15;
    }
    pRVar1 = &pWVar15->floatvalue_;
    uVar2 = (pWVar15->floatvalue_).current_size_;
    if (uVar2 == (pWVar15->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,uVar2 + 1);
      pfVar16 = google::protobuf::RepeatedField<float>::elements(pRVar1);
      pfVar16[uVar2] = 1.0;
    }
    else {
      pfVar16 = google::protobuf::RepeatedField<float>::elements(pRVar1);
      pfVar16[uVar2] = 1.0;
    }
    pRVar1->current_size_ = uVar2 + 1;
    iVar24 = iVar24 + -1;
  } while (iVar24 != 0);
  iVar24 = 3;
  do {
    pWVar15 = (LVar13.gru_)->resetgateweightmatrix_;
    if (pWVar15 == (WeightParams *)0x0) {
      uVar4 = ((LVar13.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
      pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        pAVar22 = *(Arena **)pAVar22;
      }
      pWVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar22);
      (LVar13.gru_)->resetgateweightmatrix_ = pWVar15;
    }
    pRVar1 = &pWVar15->floatvalue_;
    uVar2 = (pWVar15->floatvalue_).current_size_;
    if (uVar2 == (pWVar15->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,uVar2 + 1);
      pfVar16 = google::protobuf::RepeatedField<float>::elements(pRVar1);
      pfVar16[uVar2] = 1.0;
    }
    else {
      pfVar16 = google::protobuf::RepeatedField<float>::elements(pRVar1);
      pfVar16[uVar2] = 1.0;
    }
    pRVar1->current_size_ = uVar2 + 1;
    iVar24 = iVar24 + -1;
  } while (iVar24 != 0);
  CoreML::validate<(MLModelType)500>(&local_50,&local_80);
  bVar5 = CoreML::Result::good(&local_50);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xa46);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  }
  else {
    psVar18 = CoreML::Result::message_abi_cxx11_(&local_50);
    iVar24 = 0;
    lVar19 = std::__cxx11::string::find((char *)psVar18,0x397861,0);
    if (lVar19 != -1) goto LAB_0017152c;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xa47);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,
               "res.message().find(\"if set, output shape must be of length 3\") != std::string::npos"
               ,0x53);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  }
  std::ostream::put((char)poVar17);
  iVar24 = 1;
  std::ostream::flush();
LAB_0017152c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_80);
  return iVar24;
}

Assistant:

int testInvalidDeConvolution3DOutputShape() {
    Specification::Model m1;

    int input_channels = 3;
    int output_channels = 3;
    int kernel_depth = 3;
    int kernel_height = 3;
    int kernel_width = 3;
    int nGroups = 1;
    int stride_depth = 1;
    int stride_height = 1;
    int stride_width = 1;
    int dilation_depth = 1;
    int dilation_height = 1;
    int dilation_width = 1;
    int pad_front = 0;
    int pad_back = 0;
    int pad_top = 0;
    int pad_bottom = 0;
    int pad_left = 0;
    int pad_right = 0;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(3);
    shape->add_shape(32);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution3d();
    params->set_inputchannels(input_channels);
    params->set_outputchannels(output_channels);
    params->set_kerneldepth(kernel_depth);
    params->set_kernelheight(kernel_height);
    params->set_kernelwidth(kernel_width);
    params->set_ngroups(nGroups);
    params->set_stridedepth(stride_depth);
    params->set_strideheight(stride_height);
    params->set_stridewidth(stride_width);
    params->set_dilationdepth(dilation_depth);
    params->set_dilationheight(dilation_height);
    params->set_dilationwidth(dilation_width);
    params->set_paddingtype(CoreML::Specification::Convolution3DLayerParams_PaddingType_CUSTOM);
    params->set_custompaddingfront(pad_front);
    params->set_custompaddingback(pad_back);
    params->set_custompaddingtop(pad_top);
    params->set_custompaddingbottom(pad_bottom);
    params->set_custompaddingleft(pad_left);
    params->set_custompaddingright(pad_right);
    params->set_isdeconvolution(true);
    params->add_outputshape(4);
    params->set_hasbias(true);

    // Fill weights
    for (int i = 0; i < output_channels * (input_channels / nGroups) * kernel_depth * kernel_height * kernel_width; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    // Fill bias
    for (int i = 0; i < output_channels; i++) {
        params->mutable_bias()->add_floatvalue(1.0);
    }

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("if set, output shape must be of length 3") != std::string::npos);
    return 0;
}